

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O3

void Gia_GlaAddToCounters(Gla_Man_t *p,Vec_Int_t *vCore)

{
  int *piVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  
  if (0 < vCore->nSize) {
    piVar3 = vCore->pArray;
    lVar4 = 0;
    do {
      iVar2 = piVar3[lVar4];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
        __assert_fail("i >= 0 && i < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                      ,0x6e,"Gla_Obj_t *Gla_ManObj(Gla_Man_t *, int)");
      }
      iVar2 = p->pObjs[iVar2].iGiaObj;
      if (((long)iVar2 < 0) || (p->vCoreCounts->nSize <= iVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      piVar1 = p->vCoreCounts->pArray + iVar2;
      *piVar1 = *piVar1 + 1;
      lVar4 = lVar4 + 1;
    } while (lVar4 < vCore->nSize);
  }
  return;
}

Assistant:

void Gia_GlaAddToCounters( Gla_Man_t * p, Vec_Int_t * vCore )
{
    Gla_Obj_t * pGla;
    int i;
    Gla_ManForEachObjAbsVec( vCore, p, pGla, i )
        Vec_IntAddToEntry( p->vCoreCounts, pGla->iGiaObj, 1 );
}